

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool optional;
  bool never;
  bool exclude_from_all;
  MessageLevel message;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  cmInstallDirectoryGenerator *this_01;
  cmGlobalGenerator *this_02;
  bool bVar6;
  string *psVar7;
  int iVar8;
  ulong uVar9;
  string destinationStr;
  pointer local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string literal_args;
  string local_260;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string type;
  string component;
  string permissions_dir;
  string permissions_file;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&component,(string *)&this->DefaultComponentName);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  bVar6 = false;
  literal_args.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  optional = false;
  exclude_from_all = false;
  never = false;
  local_2c0 = (pointer)0x0;
  iVar8 = 1;
  for (uVar9 = 1;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    bVar2 = std::operator==(pbVar1 + uVar9,"DESTINATION");
    if (bVar2) {
      iVar8 = 2;
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"TYPE");
    if (bVar2) {
      iVar8 = 10;
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"OPTIONAL");
    if (bVar2) {
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      iVar8 = 0;
      optional = true;
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"MESSAGE_NEVER");
    if (bVar2) {
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      iVar8 = 0;
      never = true;
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"PATTERN");
    if (bVar2) {
      bVar6 = true;
      iVar8 = 3;
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"REGEX");
    if (bVar2) {
      bVar6 = true;
      iVar8 = 4;
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"EXCLUDE");
    if (bVar2) {
      if ((iVar8 - 5U < 0xfffffffe) && (bVar6)) goto LAB_001b5d81;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," does not allow \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" before a PATTERN or REGEX is given.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
      goto LAB_001b65c3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"PERMISSIONS");
    if (bVar2) {
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" before a PATTERN or REGEX is given.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      std::__cxx11::string::append((char *)&literal_args);
      iVar8 = 7;
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILE_PERMISSIONS");
    if (bVar2) {
      iVar8 = 5;
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,
                            "DIRECTORY_PERMISSIONS");
    if (bVar2) {
      iVar8 = 6;
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      goto LAB_001b5d45;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,
                            "USE_SOURCE_PERMISSIONS");
    if (bVar2) {
      if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," does not allow \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" after PATTERN or REGEX.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
LAB_001b5d81:
      std::__cxx11::string::append((char *)&literal_args);
      goto LAB_001b5d8b;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILES_MATCHING");
    if (bVar2) {
      if (!bVar6) goto LAB_001b5d81;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," does not allow \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
LAB_001b65c3:
      std::__cxx11::string::~string((string *)&destinationStr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_001b65da:
      bVar6 = false;
      goto LAB_001b65dc;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"CONFIGURATIONS");
    if (bVar2) {
      iVar8 = 8;
      if (!bVar6) goto LAB_001b5d45;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," does not allow \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
      goto LAB_001b65c3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"COMPONENT");
    if (bVar2) {
      iVar8 = 9;
      if (!bVar6) goto LAB_001b5d45;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," does not allow \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
      goto LAB_001b65c3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar9,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      if (!bVar6) {
        iVar8 = 0;
        exclude_from_all = true;
        goto LAB_001b5d45;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," does not allow \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" after PATTERN or REGEX.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
      goto LAB_001b65c3;
    }
    if (9 < iVar8 - 1U) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," given unknown argument \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\".");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&destinationStr);
      goto LAB_001b65c3;
    }
    psVar7 = &component;
    switch(iVar8) {
    case 1:
      std::__cxx11::string::string
                ((string *)&destinationStr,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      sVar3 = cmGeneratorExpression::Find(&destinationStr);
      if ((sVar3 != 0) && (bVar2 = cmsys::SystemTools::FileIsFullPath(&destinationStr), !bVar2)) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        std::__cxx11::string::_M_assign((string *)&destinationStr);
        std::__cxx11::string::append((char *)&destinationStr);
        std::__cxx11::string::append((string *)&destinationStr);
      }
      bVar2 = cmsys::SystemTools::FileExists(&destinationStr);
      if ((!bVar2) || (bVar2 = cmsys::SystemTools::FileIsDirectory(&destinationStr), bVar2)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,
                   &destinationStr);
        std::__cxx11::string::~string((string *)&destinationStr);
        iVar8 = 1;
        break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar5 = std::operator<<(poVar5," given non-directory \"");
      poVar5 = std::operator<<(poVar5,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar9));
      std::operator<<(poVar5,"\" to install.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&destinationStr);
      goto LAB_001b65da;
    case 2:
      local_2c0 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p;
      goto LAB_001b5d8b;
    case 3:
      std::__cxx11::string::append((char *)&literal_args);
      cmsys::Glob::PatternToRegex
                ((string *)&e,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar9,false,false);
      cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
      goto LAB_001b60da;
    case 4:
      std::__cxx11::string::append((char *)&literal_args);
      std::__cxx11::string::string
                ((string *)&e,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
LAB_001b60da:
      std::__cxx11::string::~string((string *)&e);
LAB_001b5d8b:
      iVar8 = 0;
      break;
    case 5:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9,&permissions_file);
      iVar8 = 5;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," given invalid file permission \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      break;
    case 6:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9,&permissions_dir);
      iVar8 = 6;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," given invalid directory permission \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      break;
    case 7:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9,&literal_args);
      iVar8 = 7;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," given invalid permission \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\".");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      break;
    case 8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&configurations,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar9);
      iVar8 = 8;
      break;
    case 9:
      goto switchD_001b5f1a_caseD_9;
    case 10:
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&allowedTypes_abi_cxx11_,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9);
      psVar7 = &type;
      if (sVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,
                                 (string *)
                                 (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        poVar5 = std::operator<<(poVar5," given non-type \"");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + uVar9));
        std::operator<<(poVar5,"\" with TYPE argument.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        goto LAB_001b65c3;
      }
      goto switchD_001b5f1a_caseD_9;
    }
LAB_001b5d45:
  }
  if ((dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (local_2c0 != (pointer)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&dirs);
  }
  if (dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = true;
    goto LAB_001b65dc;
  }
  destinationStr._M_dataplus._M_p = (pointer)&destinationStr.field_2;
  destinationStr._M_string_length = 0;
  destinationStr.field_2._M_local_buf[0] = '\0';
  if (local_2c0 == (pointer)0x0) {
    if (type._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar5," given no DESTINATION!");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_260);
      goto LAB_001b652f;
    }
    GetDestinationForType((string *)&e,this,(cmInstallCommandArguments *)0x0,&type);
    std::__cxx11::string::operator=((string *)&destinationStr,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    local_2c0 = destinationStr._M_dataplus._M_p;
LAB_001b63be:
    message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,never);
    this_00 = (this->super_cmCommand).Makefile;
    this_01 = (cmInstallDirectoryGenerator *)operator_new(0x140);
    cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
              (this_01,&dirs,local_2c0,permissions_file._M_dataplus._M_p,
               permissions_dir._M_dataplus._M_p,&configurations,component._M_dataplus._M_p,message,
               exclude_from_all,literal_args._M_dataplus._M_p,optional);
    cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
    this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar6 = true;
    cmGlobalGenerator::AddInstallComponent(this_02,&component);
  }
  else {
    if (type._M_string_length == 0) goto LAB_001b63be;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar5," given both TYPE and DESTINATION arguments. You may only specify one.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_260);
LAB_001b652f:
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar6 = false;
  }
  std::__cxx11::string::~string((string *)&destinationStr);
LAB_001b65dc:
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&literal_args);
  std::__cxx11::string::~string((string *)&component);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  std::__cxx11::string::~string((string *)&permissions_dir);
  std::__cxx11::string::~string((string *)&permissions_file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  return bVar6;
switchD_001b5f1a_caseD_9:
  std::__cxx11::string::_M_assign((string *)psVar7);
  goto LAB_001b5d8b;
}

Assistant:

bool cmInstallCommand::HandleDirectoryMode(
  std::vector<std::string> const& args)
{
  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent,
    DoingType
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = nullptr;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  std::string type;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "TYPE") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the type.
      doing = DoingType;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir)) {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        std::ostringstream e;
        e << args[0] << " given non-directory \"" << args[i]
          << "\" to install.";
        this->SetError(e.str());
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(std::move(dir));
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingType) {
      if (allowedTypes.count(args[i]) == 0) {
        std::ostringstream e;
        e << args[0] << " given non-type \"" << args[i]
          << "\" with TYPE argument.";
        this->SetError(e.str());
        return false;
      }

      type = args[i];
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        std::ostringstream e;
        e << args[0] << " given invalid permission \"" << args[i] << "\".";
        this->SetError(e.str());
        return false;
      }
    } else {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.emplace_back();
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  std::string destinationStr;
  if (!destination) {
    if (type.empty()) {
      // A destination is required.
      std::ostringstream e;
      e << args[0] << " given no DESTINATION!";
      this->SetError(e.str());
      return false;
    }
    destinationStr = this->GetDestinationForType(nullptr, type);
    destination = destinationStr.c_str();
  } else if (!type.empty()) {
    std::ostringstream e;
    e << args[0]
      << " given both TYPE and DESTINATION arguments. You may only specify "
         "one.";
    this->SetError(e.str());
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(new cmInstallDirectoryGenerator(
    dirs, destination, permissions_file.c_str(), permissions_dir.c_str(),
    configurations, component.c_str(), message, exclude_from_all,
    literal_args.c_str(), optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}